

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

void __thiscall Json::StyledStreamWriter::writeIndent(StyledStreamWriter *this)

{
  ostream *poVar1;
  char local_9;
  
  local_9 = '\n';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(this->document_,&local_9,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(this->indentString_)._M_dataplus._M_p,(this->indentString_)._M_string_length);
  return;
}

Assistant:

void StyledStreamWriter::writeIndent() {
  /*
    Some comments in this method would have been nice. ;-)

   if ( !document_.empty() )
   {
      char last = document_[document_.length()-1];
      if ( last == ' ' )     // already indented
         return;
      if ( last != '\n' )    // Comments may add new-line
         *document_ << '\n';
   }
  */
  *document_ << '\n' << indentString_;
}